

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numcontext.cpp
# Opt level: O1

void __thiscall NumContext::NumContext(NumContext *this,int num)

{
  string *psVar1;
  size_t sVar2;
  char buf [64];
  long *local_88 [2];
  long local_78 [2];
  char local_68 [64];
  
  Context::Context(&this->super_Context);
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__NumContext_00104d40;
  sprintf(local_68,"%d",num);
  psVar1 = (string *)operator_new(0x20);
  *(string **)psVar1 = psVar1 + 0x10;
  sVar2 = strlen(local_68);
  std::__cxx11::string::_M_construct<char_const*>(psVar1,local_68,local_68 + sVar2);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,*(long *)psVar1,*(long *)(psVar1 + 8) + *(long *)psVar1);
  (*(this->super_Context)._vptr_Context[3])(this,local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return;
}

Assistant:

NumContext::NumContext(int num)
{
	char buf[64];
	sprintf(buf,"%d", num);

	setData(*(new string(buf)));
}